

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O3

int CfdGetDescriptorMultisigKey
              (void *handle,void *descriptor_handle,uint32_t key_index,int *key_type,char **pubkey,
              char **ext_pubkey,char **ext_privkey)

{
  pointer puVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  CfdException *this;
  ulong uVar10;
  ulong uVar11;
  char *work_ext_pubkey;
  char *work_pubkey;
  DescriptorKeyData key_data;
  undefined1 local_208 [40];
  pointer local_1e0;
  pointer puStack_1d8;
  pointer local_1d0;
  pointer local_1c8;
  pointer puStack_1c0;
  pointer local_1b8;
  pointer local_1b0;
  pointer puStack_1a8;
  pointer puStack_1a0;
  pointer local_198;
  char *local_188;
  char *local_180;
  Pubkey local_178;
  void *local_158;
  undefined8 local_150;
  ExtPubkey local_148;
  undefined1 local_d8 [40];
  pointer local_b0;
  pointer puStack_a8;
  pointer local_a0;
  pointer local_98;
  pointer puStack_90;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  pointer puStack_70;
  pointer local_68;
  int local_58;
  string local_50;
  
  local_180 = (char *)0x0;
  local_188 = (char *)0x0;
  local_150 = 0;
  local_158 = handle;
  cfd::Initialize();
  puVar1 = local_d8 + 0x10;
  local_d8._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Descriptor","");
  cfd::capi::CheckBuffer(descriptor_handle,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != puVar1) {
    operator_delete((void *)local_d8._0_8_);
  }
  plVar2 = *(long **)((long)descriptor_handle + 0x20);
  if (plVar2 == (long *)0x0) {
LAB_003d8f5f:
    local_d8._0_8_ = "cfdcapi_address.cpp";
    local_d8._8_4_ = 0x2f4;
    local_d8._16_8_ = "CfdGetDescriptorMultisigKey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_d8,kCfdLogLevelWarning,"key index is maximum over.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_d8._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Failed to parameter. key index is maximum over.","");
    cfd::core::CfdException::CfdException(this,kCfdOutOfRangeError,(string *)local_d8);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar10 = (ulong)key_index;
  lVar3 = *plVar2;
  uVar11 = (plVar2[1] - lVar3 >> 3) * -0x3333333333333333;
  if (uVar11 < uVar10 || uVar11 - uVar10 == 0) goto LAB_003d8f5f;
  local_58 = *(int *)(lVar3 + uVar10 * 0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  lVar4 = *(long *)(lVar3 + 8 + uVar10 * 0x28);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar4,*(long *)(lVar3 + 0x10 + uVar10 * 0x28) + lVar4);
  if (key_type != (int *)0x0) {
    *key_type = local_58;
  }
  cfd::core::Pubkey::Pubkey(&local_178);
  cfd::core::ExtPubkey::ExtPubkey(&local_148);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_d8);
  if (local_58 == 2) {
    cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_208,&local_50);
    puVar1 = local_148.serialize_data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_148.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_208._0_8_;
    local_148.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_208._8_8_;
    local_148.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_208._16_8_;
    local_208._0_8_ = (pointer)0x0;
    local_208._8_8_ = (pointer)0x0;
    local_208._16_8_ = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_148.chaincode_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_148.version_ = local_208._24_4_;
    local_148.fingerprint_ = local_208._28_4_;
    local_148.depth_ = local_208[0x20];
    local_148._33_3_ = local_208._33_3_;
    local_148.child_num_ = local_208._36_4_;
    local_148.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_1e0;
    local_148.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_1d8;
    local_148.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_1d0;
    local_1e0 = (pointer)0x0;
    puStack_1d8 = (pointer)0x0;
    local_1d0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_148.pubkey_.data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_148.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_1c8;
    local_148.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_1c0;
    local_148.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_1b8;
    local_1c8 = (pointer)0x0;
    puStack_1c0 = (pointer)0x0;
    local_1b8 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = local_148.tweak_sum_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_148.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_1b0;
    local_148.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_1a8;
    local_148.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_1a0;
    local_1b0 = (pointer)0x0;
    puStack_1a8 = (pointer)0x0;
    puStack_1a0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if (local_1b0 != (pointer)0x0) {
        operator_delete(local_1b0);
      }
    }
    if (local_1c8 != (pointer)0x0) {
      operator_delete(local_1c8);
    }
    if (local_1e0 != (pointer)0x0) {
      operator_delete(local_1e0);
    }
    if ((pointer)local_208._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_208._0_8_);
    }
    cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_208,&local_148);
LAB_003d8d3a:
    puVar1 = local_178.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_178.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_208._0_8_;
    local_178.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_208._8_8_;
    local_178.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_208._16_8_;
    local_208._0_8_ = (pointer)0x0;
    local_208._8_8_ = (pointer)0x0;
    local_208._16_8_ = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if ((pointer)local_208._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_208._0_8_);
      }
    }
  }
  else {
    if (local_58 == 3) {
      cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_208,&local_50);
      uVar5 = local_d8._0_8_;
      local_d8._0_8_ = local_208._0_8_;
      local_d8._8_8_ = local_208._8_8_;
      local_d8._16_8_ = local_208._16_8_;
      local_208._0_8_ = (pointer)0x0;
      local_208._8_8_ = (pointer)0x0;
      local_208._16_8_ = (pointer)0x0;
      if ((pointer)uVar5 != (pointer)0x0) {
        operator_delete((void *)uVar5);
      }
      puVar1 = local_b0;
      local_d8._24_8_ = local_208._24_8_;
      local_d8._32_8_ = local_208._32_8_;
      local_b0 = local_1e0;
      puStack_a8 = puStack_1d8;
      local_a0 = local_1d0;
      local_1e0 = (pointer)0x0;
      puStack_1d8 = (pointer)0x0;
      local_1d0 = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      puVar1 = local_98;
      local_98 = local_1c8;
      puStack_90 = puStack_1c0;
      local_88 = local_1b8;
      local_1c8 = (pointer)0x0;
      puStack_1c0 = (pointer)0x0;
      local_1b8 = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      puVar1 = local_78;
      local_80 = local_1b0;
      local_78 = puStack_1a8;
      puStack_70 = puStack_1a0;
      local_68 = local_198;
      puStack_1a8 = (pointer)0x0;
      puStack_1a0 = (pointer)0x0;
      local_198 = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
        if (puStack_1a8 != (pointer)0x0) {
          operator_delete(puStack_1a8);
        }
      }
      if (local_1c8 != (pointer)0x0) {
        operator_delete(local_1c8);
      }
      if (local_1e0 != (pointer)0x0) {
        operator_delete(local_1e0);
      }
      if ((pointer)local_208._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_208._0_8_);
      }
      cfd::core::ExtPrivkey::GetExtPubkey((ExtPubkey *)local_208,(ExtPrivkey *)local_d8);
      puVar1 = local_148.serialize_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_148.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_208._0_8_;
      local_148.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_208._8_8_;
      local_148.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_208._16_8_;
      local_208._0_8_ = (pointer)0x0;
      local_208._8_8_ = (pointer)0x0;
      local_208._16_8_ = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      puVar1 = local_148.chaincode_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_148.version_ = local_208._24_4_;
      local_148.fingerprint_ = local_208._28_4_;
      local_148.depth_ = local_208[0x20];
      local_148._33_3_ = local_208._33_3_;
      local_148.child_num_ = local_208._36_4_;
      local_148.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_1e0;
      local_148.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_1d8;
      local_148.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_1d0;
      local_1e0 = (pointer)0x0;
      puStack_1d8 = (pointer)0x0;
      local_1d0 = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      puVar1 = local_148.pubkey_.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_148.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = local_1c8;
      local_148.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_1c0;
      local_148.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1b8;
      local_1c8 = (pointer)0x0;
      puStack_1c0 = (pointer)0x0;
      local_1b8 = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      puVar1 = local_148.tweak_sum_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_148.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_1b0;
      local_148.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_1a8;
      local_148.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_1a0;
      local_1b0 = (pointer)0x0;
      puStack_1a8 = (pointer)0x0;
      puStack_1a0 = (pointer)0x0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
        if (local_1b0 != (pointer)0x0) {
          operator_delete(local_1b0);
        }
      }
      if (local_1c8 != (pointer)0x0) {
        operator_delete(local_1c8);
      }
      if (local_1e0 != (pointer)0x0) {
        operator_delete(local_1e0);
      }
      if ((pointer)local_208._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_208._0_8_);
      }
      cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_208,&local_148);
      goto LAB_003d8d3a;
    }
    if (local_50._M_string_length != 0) {
      cfd::core::Pubkey::Pubkey((Pubkey *)local_208,&local_50);
      goto LAB_003d8d3a;
    }
  }
  if (pubkey == (char **)0x0) {
LAB_003d8dd1:
    pcVar7 = (char *)0x0;
  }
  else {
    bVar6 = cfd::core::Pubkey::IsValid(&local_178);
    if (!bVar6) goto LAB_003d8dd1;
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_208,&local_178);
    pcVar7 = cfd::capi::CreateString((string *)local_208);
    local_180 = pcVar7;
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_);
    }
  }
  if (ext_pubkey == (char **)0x0) {
LAB_003d8e22:
    pcVar8 = (char *)0x0;
  }
  else {
    bVar6 = cfd::core::ExtPubkey::IsValid(&local_148);
    if (!bVar6) goto LAB_003d8e22;
    cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)local_208,&local_148);
    pcVar8 = cfd::capi::CreateString((string *)local_208);
    local_188 = pcVar8;
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_);
    }
  }
  if (ext_privkey != (char **)0x0) {
    bVar6 = cfd::core::ExtPrivkey::IsValid((ExtPrivkey *)local_d8);
    if (bVar6) {
      cfd::core::ExtPrivkey::ToString_abi_cxx11_((string *)local_208,(ExtPrivkey *)local_d8);
      pcVar9 = cfd::capi::CreateString((string *)local_208);
      if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
        operator_delete((void *)local_208._0_8_);
      }
      goto LAB_003d8e75;
    }
  }
  pcVar9 = (char *)0x0;
LAB_003d8e75:
  if (pcVar7 != (char *)0x0) {
    *pubkey = pcVar7;
  }
  if (pcVar8 != (char *)0x0) {
    *ext_pubkey = pcVar8;
  }
  if (pcVar9 != (char *)0x0) {
    *ext_privkey = pcVar9;
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78);
  }
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98);
  }
  if (local_b0 != (pointer)0x0) {
    operator_delete(local_b0);
  }
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_);
  }
  if (local_148.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_148.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_148.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_148.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_178.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int CfdGetDescriptorMultisigKey(
    void* handle, void* descriptor_handle, uint32_t key_index, int* key_type,
    char** pubkey, char** ext_pubkey, char** ext_privkey) {
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->multisig_key_list == nullptr) ||
        (key_index >= buffer->multisig_key_list->size())) {
      warn(CFD_LOG_SOURCE, "key index is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. key index is maximum over.");
    }

    DescriptorKeyData key_data = (*buffer->multisig_key_list)[key_index];
    if (key_type != nullptr) {
      *key_type = key_data.type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    switch (key_data.type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(key_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(key_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!key_data.key.empty()) pubkey_obj = Pubkey(key_data.key);
        break;
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }

    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_pubkey, &work_ext_pubkey, &work_ext_privkey);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_pubkey, &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_pubkey, &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}